

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.h
# Opt level: O0

process_status __thiscall
state_machine::state_machine::
StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Empty>,state_machine::transition::Event<(anonymous_namespace)::open_close>,state_machine::transition::detail::guard_always,(anonymous_namespace)::open_drawer,state_machine::transition::State<(anonymous_namespace)::Open>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Empty>,state_machine::transition::Event<(anonymous_namespace)::cd_detected>,(anonymous_namespace)::cd_detected_guard,(anonymous_namespace)::stop_playback,state_machine::transition::State<(anonymous_namespace)::Stopped>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Stopped>,state_machine::transition::Event<(anonymous_namespace)::play>,state_machine::transition::detail::guard_always,(anonymous_namesp...us_namespace)::stop_and_open,state_machine::transition::State<(anonymous_namespace)::Open>>>>const&>
::find_row<(anonymous_namespace)::open_close,4ul,5ul>
          (StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Empty>,state_machine::transition::Event<(anonymous_namespace)::open_close>,state_machine::transition::detail::guard_always,(anonymous_namespace)::open_drawer,state_machine::transition::State<(anonymous_namespace)::Open>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Empty>,state_machine::transition::Event<(anonymous_namespace)::cd_detected>,(anonymous_namespace)::cd_detected_guard,(anonymous_namespace)::stop_playback,state_machine::transition::State<(anonymous_namespace)::Stopped>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Stopped>,state_machine::transition::Event<(anonymous_namespace)::play>,state_machine::transition::detail::guard_always,(anonymous_namesp___us_namespace)::stop_and_open,state_machine::transition::State<(anonymous_namespace)::Open>>>>const&>
           *this,char *event,int param_3)

{
  char *pcVar1;
  process_status local_31;
  open_close *event_local;
  StateMachine<_9a4d5606_> *this_local;
  
  pcVar1 = variant::
           Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
           ::index((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                    *)(this + 8),event,param_3);
  if (((ulong)pcVar1 & 0xff) == 4) {
    local_31 = StateMachine<$9a4d5606$>::
               get_row_transitions<(anonymous_namespace)::open_close,_std::integral_constant<unsigned_long,_8UL>,_0>
                         ((StateMachine<_9a4d5606_> *)this,event);
  }
  else {
    local_31 = StateMachine<$9a4d5606$>::find_row<(anonymous_namespace)::open_close,_5UL>
                         ((StateMachine<_9a4d5606_> *)this,event);
  }
  return local_31;
}

Assistant:

constexpr auto find_row(Event&& event, std::index_sequence<I, Is...>) -> process_status {
        using state_type =
            typename variant_type::alternative_index_map::template at_value<aux::index_constant<I>>;

        using key_type = transition::Key<transition::State<state_type>, transition::Event<Event>>;

        return (state_.index() == I) ?
                   get_row_transitions(std::forward<Event>(event),
                                       typename std::decay_t<Table>::row_index_map::
                                           template at_key<key_type, transition_not_found>{}) :
                   find_row(std::forward<Event>(event), std::index_sequence<Is...>{});
    }